

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void __thiscall
transaction_tests::test_big_witness_transaction::test_method(test_big_witness_transaction *this)

{
  uchar *puVar1;
  long lVar2;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar3;
  ulong uVar4;
  reference pvVar5;
  iterator in_R8;
  iterator in_R9;
  uint nIn;
  ulong uVar6;
  int iVar7;
  long in_FS_OFFSET;
  bool bVar8;
  const_string msg;
  const_string file;
  span<const_std::byte,_18446744073709551615UL> b;
  string_view hex;
  check_type cVar9;
  PrecomputedTransactionData *local_858;
  bool local_84d;
  uint local_84c;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  uint local_82c;
  vector<Coin,_std::allocator<Coin>_> coins;
  DataStream ssout;
  vector<int,_std::allocator<int>_> sigHashes;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  CKey key;
  CMutableTransaction mtx;
  CCheckQueueControl<CScriptCheck> control;
  CCheckQueue<FakeCheckCheckCompletion> scriptcheckqueue;
  PrecomputedTransactionData txdata;
  CTransaction tx;
  SignatureCache signature_cache;
  _Rb_tree_node_base local_330;
  size_t local_310;
  _Rb_tree_node_base local_300;
  size_t local_2e0;
  pointer puStack_2d8;
  pointer local_2d0;
  pointer puStack_2c8;
  _Rb_tree_node_base local_2b8;
  size_t local_298;
  _Rb_tree_node_base local_288;
  size_t local_268;
  _Rb_tree_node_base local_258;
  size_t local_238;
  pointer pCStack_230;
  pointer local_228;
  pointer pCStack_220;
  pointer local_218;
  pointer pCStack_210;
  pointer local_208;
  uchar auStack_200 [64];
  _Rb_tree_node_base local_1c0;
  size_t local_1a0;
  _Rb_tree_node_base local_190;
  size_t local_170;
  _Rb_tree_node_base local_160;
  size_t local_140;
  _Rb_tree_node_base local_130;
  size_t local_110;
  CScript scriptPubKey;
  CKeyID hash;
  FillableSigningProvider keystore;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&mtx);
  mtx.version = 1;
  GenerateRandomKey(SUB81(&key,0));
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_0114aee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x213;
  file.m_begin = (iterator)&local_7b0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_7c0,msg);
  CKey::GetPubKey((CPubKey *)&signature_cache,&key);
  scriptcheckqueue.m_mutex.super_mutex.super___mutex_base._M_mutex.__size[0] =
       FillableSigningProvider::AddKeyPubKey(&keystore,&key,(CPubKey *)&signature_cache);
  scriptcheckqueue.m_mutex.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  scriptcheckqueue.m_mutex.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_11aacd2;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0xc3e992;
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ &
       0xffffffffffffff00;
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       &PTR__lazy_ostream_0113a070;
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_7c8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptcheckqueue,(lazy_ostream *)&txdata,1,0,WARN,_cVar9,
             (size_t)&local_7d0,0x213);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&scriptcheckqueue.m_mutex.super_mutex.super___mutex_base._M_mutex + 0x10));
  CKey::GetPubKey((CPubKey *)&signature_cache,&key);
  CPubKey::GetID(&hash,(CPubKey *)&signature_cache);
  signature_cache.m_salted_hasher_ecdsa.s[4] = 0;
  signature_cache.m_salted_hasher_ecdsa.s[5] = 0;
  signature_cache.m_salted_hasher_ecdsa.s[6] = 0;
  signature_cache.m_salted_hasher_ecdsa.s[7] = 0;
  signature_cache.m_salted_hasher_ecdsa.s[0] = 0;
  signature_cache.m_salted_hasher_ecdsa.s[1] = 0;
  signature_cache.m_salted_hasher_ecdsa.s[2] = 0;
  signature_cache.m_salted_hasher_ecdsa.s[3] = 0;
  this_00 = CScript::operator<<((CScript *)&signature_cache,OP_0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&txdata,(uchar *)&hash,
             (uchar *)&keystore,(allocator_type *)&scriptcheckqueue);
  b._M_extent._M_extent_value =
       txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ -
       txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  b._M_ptr = (pointer)txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  ppVar3 = &CScript::operator<<(this_00,b)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&scriptPubKey.super_CScriptBase,ppVar3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txdata);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&signature_cache);
  sigHashes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  sigHashes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  sigHashes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  signature_cache.m_salted_hasher_ecdsa.s[0] = 0x82;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&sigHashes,(int *)&signature_cache);
  signature_cache.m_salted_hasher_ecdsa.s[0] = 0x83;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&sigHashes,(int *)&signature_cache);
  signature_cache.m_salted_hasher_ecdsa.s[0] = 0x81;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&sigHashes,(int *)&signature_cache);
  signature_cache.m_salted_hasher_ecdsa.s[0] = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&sigHashes,(int *)&signature_cache);
  signature_cache.m_salted_hasher_ecdsa.s[0] = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&sigHashes,(int *)&signature_cache);
  signature_cache.m_salted_hasher_ecdsa.s[0] = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&sigHashes,(int *)&signature_cache);
  iVar7 = 0x1194;
  do {
    bVar8 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if (bVar8) {
      nIn = 0;
      while( true ) {
        if ((ulong)(((long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x68) <= (ulong)nIn) break;
        signature_cache.m_salted_hasher_ecdsa.s._0_8_ =
             signature_cache.m_salted_hasher_ecdsa.s._0_8_ & 0xffffffffffff0000;
        signature_cache.m_salted_hasher_schnorr.bytes._0_4_ = 0;
        signature_cache.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        memset(signature_cache.m_salted_hasher_ecdsa.s + 2,0,0xb8);
        signature_cache.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)&signature_cache.m_salted_hasher_schnorr.bytes
        ;
        signature_cache.setValid.size = 0;
        signature_cache.setValid._28_4_ = 0;
        signature_cache.cs_sigcache._M_impl._M_rwlock.__size[0x28] = '\0';
        local_330._M_color = _S_red;
        local_330._M_parent = (_Base_ptr)0x0;
        local_330._M_left = &local_330;
        local_310 = 0;
        local_300._M_color = _S_red;
        local_300._M_parent = (_Base_ptr)0x0;
        local_300._M_left = &local_300;
        local_2b8._M_color = _S_red;
        local_2b8._M_parent = (_Base_ptr)0x0;
        local_2e0 = 0;
        puStack_2d8 = (pointer)0x0;
        local_2d0 = (pointer)0x0;
        puStack_2c8 = (pointer)0x0;
        local_2b8._M_left = &local_2b8;
        local_298 = 0;
        local_288._M_color = _S_red;
        local_288._M_parent = (_Base_ptr)0x0;
        local_288._M_left = &local_288;
        local_268 = 0;
        local_258._M_color = _S_red;
        local_258._M_parent = (_Base_ptr)0x0;
        local_258._M_left = &local_258;
        local_1c0._M_color = _S_red;
        local_1c0._M_parent = (_Base_ptr)0x0;
        local_238 = 0;
        pCStack_230 = (pointer)0x0;
        local_228 = (pointer)0x0;
        pCStack_220 = (pointer)0x0;
        local_218 = (pointer)0x0;
        pCStack_210 = (pointer)0x0;
        local_208 = (pointer)0x0;
        auStack_200[0] = '\0';
        auStack_200[1] = '\0';
        auStack_200[2] = '\0';
        auStack_200[3] = '\0';
        auStack_200[4] = '\0';
        auStack_200[5] = '\0';
        auStack_200[6] = '\0';
        auStack_200[7] = '\0';
        auStack_200[8] = '\0';
        auStack_200[9] = '\0';
        auStack_200[10] = '\0';
        auStack_200[0xb] = '\0';
        auStack_200[0xc] = '\0';
        auStack_200[0xd] = '\0';
        auStack_200[0xe] = '\0';
        auStack_200[0xf] = '\0';
        auStack_200[0x10] = '\0';
        auStack_200[0x11] = '\0';
        auStack_200[0x12] = '\0';
        auStack_200[0x13] = '\0';
        auStack_200[0x14] = '\0';
        auStack_200[0x15] = '\0';
        auStack_200[0x16] = '\0';
        auStack_200[0x17] = '\0';
        auStack_200[0x18] = '\0';
        auStack_200[0x19] = '\0';
        auStack_200[0x1a] = '\0';
        auStack_200[0x1b] = '\0';
        auStack_200[0x1c] = '\0';
        auStack_200[0x1d] = '\0';
        auStack_200[0x1e] = '\0';
        auStack_200[0x1f] = '\0';
        auStack_200[0x20] = '\0';
        auStack_200[0x21] = '\0';
        auStack_200[0x22] = '\0';
        auStack_200[0x23] = '\0';
        auStack_200[0x24] = '\0';
        auStack_200[0x25] = '\0';
        auStack_200[0x26] = '\0';
        auStack_200[0x27] = '\0';
        auStack_200[0x28] = '\0';
        auStack_200[0x29] = '\0';
        auStack_200[0x2a] = '\0';
        auStack_200[0x2b] = '\0';
        auStack_200[0x2c] = '\0';
        auStack_200[0x2d] = '\0';
        auStack_200[0x2e] = '\0';
        auStack_200[0x2f] = '\0';
        auStack_200[0x30] = '\0';
        auStack_200[0x31] = '\0';
        auStack_200[0x32] = '\0';
        auStack_200[0x33] = '\0';
        local_1c0._M_left = &local_1c0;
        local_1a0 = 0;
        local_190._M_color = _S_red;
        local_190._M_parent = (_Base_ptr)0x0;
        local_170 = 0;
        local_160._M_color = _S_red;
        local_160._M_parent = (_Base_ptr)0x0;
        local_140 = 0;
        local_130._M_color = _S_red;
        local_130._M_parent = (_Base_ptr)0x0;
        local_110 = 0;
        txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xe8;
        txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '\x03';
        txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        signature_cache.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             signature_cache.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_330._M_right = local_330._M_left;
        local_300._M_right = local_300._M_left;
        local_2b8._M_right = local_2b8._M_left;
        local_288._M_right = local_288._M_left;
        local_258._M_right = local_258._M_left;
        local_1c0._M_right = local_1c0._M_left;
        local_190._M_left = &local_190;
        local_190._M_right = &local_190;
        local_160._M_left = &local_160;
        local_160._M_right = &local_160;
        local_130._M_left = &local_130;
        local_130._M_right = &local_130;
        pvVar5 = std::vector<int,_std::allocator<int>_>::at
                           (&sigHashes,
                            (ulong)nIn %
                            (ulong)((long)sigHashes.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)sigHashes.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        bVar8 = SignSignature(&keystore.super_SigningProvider,&scriptPubKey,&mtx,nIn,
                              (CAmount *)&txdata,*pvVar5,(SignatureData *)&signature_cache);
        if (!bVar8) {
          __assert_fail("hashSigned",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                        ,0x231,"void transaction_tests::test_big_witness_transaction::test_method()"
                       );
        }
        SignatureData::~SignatureData((SignatureData *)&signature_cache);
        nIn = nIn + 1;
      }
      ssout.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ssout.m_read_pos = 0;
      ssout.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ssout.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      signature_cache.m_salted_hasher_ecdsa.s._0_8_ = &::TX_WITH_WITNESS;
      signature_cache.m_salted_hasher_ecdsa.s._8_8_ = &mtx;
      ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Serialize<DataStream>
                ((ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)&signature_cache,&ssout
                );
      CTransaction::CTransaction<DataStream>(&tx,&::TX_WITH_WITNESS,&ssout);
      PrecomputedTransactionData::PrecomputedTransactionData<CTransaction>(&txdata,&tx);
      CCheckQueue<CScriptCheck>::CCheckQueue
                ((CCheckQueue<CScriptCheck> *)&scriptcheckqueue,0x80,0x14);
      control.fDone = false;
      control.pqueue = (CCheckQueue<CScriptCheck> *)&scriptcheckqueue;
      std::mutex::lock(&scriptcheckqueue.m_control_mutex.super_mutex);
      coins.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      coins.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      coins.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar4 = 0;
      ppVar3 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (signature_cache.m_salted_hasher_ecdsa.s + 2);
      while( true ) {
        if ((ulong)(((long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x68) <= uVar4) break;
        Coin::Coin((Coin *)&signature_cache);
        signature_cache.m_salted_hasher_ecdsa.buf[8] = '\x02';
        signature_cache.m_salted_hasher_ecdsa.buf[9] = '\0';
        signature_cache.m_salted_hasher_ecdsa.buf[10] = '\0';
        signature_cache.m_salted_hasher_ecdsa.buf[0xb] = '\0';
        signature_cache.m_salted_hasher_ecdsa.s[0] = 1000;
        signature_cache.m_salted_hasher_ecdsa.s[1] = 0;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (ppVar3,&scriptPubKey.super_CScriptBase);
        std::vector<Coin,_std::allocator<Coin>_>::emplace_back<Coin>
                  (&coins,(Coin *)&signature_cache);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(ppVar3);
        uVar4 = (ulong)((int)uVar4 + 1);
      }
      SignatureCache::SignatureCache(&signature_cache,0x1000000);
      local_82c = 0;
      while( true ) {
        if ((ulong)(((long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x68) <= (ulong)local_82c) break;
        vChecks.
        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vChecks.
        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vChecks.
        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_84c = 0x801;
        local_84d = false;
        local_858 = &txdata;
        std::vector<CScriptCheck,std::allocator<CScriptCheck>>::
        emplace_back<CTxOut&,CTransaction&,SignatureCache&,unsigned_int&,unsigned_int,bool,PrecomputedTransactionData*>
                  ((vector<CScriptCheck,std::allocator<CScriptCheck>> *)&vChecks,
                   &coins.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start[local_82c].prevout.n].out,&tx,&signature_cache
                   ,&local_82c,&local_84c,&local_84d,&local_858);
        CCheckQueueControl<CScriptCheck>::Add(&control,&vChecks);
        std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
                  ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&vChecks);
        local_82c = local_82c + 1;
      }
      bVar8 = CCheckQueueControl<CScriptCheck>::Wait(&control);
      if (!bVar8) {
        __assert_fail("controlCheck",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                      ,0x250,"void transaction_tests::test_big_witness_transaction::test_method()");
      }
      CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache(&signature_cache.setValid);
      std::vector<Coin,_std::allocator<Coin>_>::~vector(&coins);
      CCheckQueueControl<CScriptCheck>::~CCheckQueueControl(&control);
      CCheckQueue<CScriptCheck>::~CCheckQueue((CCheckQueue<CScriptCheck> *)&scriptcheckqueue);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
      CTransaction::~CTransaction(&tx);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ssout);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&sigHashes.super__Vector_base<int,_std::allocator<int>_>);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
      FillableSigningProvider::~FillableSigningProvider(&keystore);
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::~unique_ptr(&key.keydata);
      CMutableTransaction::~CMutableTransaction(&mtx);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
LAB_005332ba:
      __stack_chk_fail();
    }
    uVar4 = ((long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x68;
    hex._M_str = "0000000000000000000000000000000000000000000000000000000000000100";
    hex._M_len = 0x40;
    transaction_identifier<false>::FromHex
              ((optional<transaction_identifier<false>_> *)&signature_cache,hex);
    if (signature_cache.m_salted_hasher_ecdsa.buf[0] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_005332ba;
    }
    txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         signature_cache.m_salted_hasher_ecdsa.s._16_8_;
    txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         signature_cache.m_salted_hasher_ecdsa.s._24_8_;
    txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         signature_cache.m_salted_hasher_ecdsa.s._0_8_;
    txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         signature_cache.m_salted_hasher_ecdsa.s._8_8_;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              (&mtx.vin,((long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x68 + 1);
    uVar6 = uVar4 & 0xffffffff;
    puVar1 = mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6].prevout.hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10;
    *(undefined8 *)puVar1 =
         txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 8) =
         txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)
     mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start[uVar6].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)
     (mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar6].prevout.n = (uint32_t)uVar4;
    signature_cache.m_salted_hasher_ecdsa.s[4] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[5] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[6] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[7] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[0] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[1] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[2] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[3] = 0;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6].scriptSig.super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&signature_cache);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&signature_cache);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              (&mtx.vout,
               ((long)mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x28 + 1);
    mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar6].nValue = 1000;
    signature_cache.m_salted_hasher_ecdsa.s[4] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[5] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[6] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[7] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[0] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[1] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[2] = 0;
    signature_cache.m_salted_hasher_ecdsa.s[3] = 0;
    ppVar3 = &CScript::operator<<((CScript *)&signature_cache,OP_1)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6].scriptPubKey.super_CScriptBase,ppVar3);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&signature_cache);
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(test_big_witness_transaction)
{
    CMutableTransaction mtx;
    mtx.version = 1;

    CKey key = GenerateRandomKey(); // Need to use compressed keys in segwit or the signing will fail
    FillableSigningProvider keystore;
    BOOST_CHECK(keystore.AddKeyPubKey(key, key.GetPubKey()));
    CKeyID hash = key.GetPubKey().GetID();
    CScript scriptPubKey = CScript() << OP_0 << std::vector<unsigned char>(hash.begin(), hash.end());

    std::vector<int> sigHashes;
    sigHashes.push_back(SIGHASH_NONE | SIGHASH_ANYONECANPAY);
    sigHashes.push_back(SIGHASH_SINGLE | SIGHASH_ANYONECANPAY);
    sigHashes.push_back(SIGHASH_ALL | SIGHASH_ANYONECANPAY);
    sigHashes.push_back(SIGHASH_NONE);
    sigHashes.push_back(SIGHASH_SINGLE);
    sigHashes.push_back(SIGHASH_ALL);

    // create a big transaction of 4500 inputs signed by the same key
    for(uint32_t ij = 0; ij < 4500; ij++) {
        uint32_t i = mtx.vin.size();
        COutPoint outpoint(Txid::FromHex("0000000000000000000000000000000000000000000000000000000000000100").value(), i);

        mtx.vin.resize(mtx.vin.size() + 1);
        mtx.vin[i].prevout = outpoint;
        mtx.vin[i].scriptSig = CScript();

        mtx.vout.resize(mtx.vout.size() + 1);
        mtx.vout[i].nValue = 1000;
        mtx.vout[i].scriptPubKey = CScript() << OP_1;
    }

    // sign all inputs
    for(uint32_t i = 0; i < mtx.vin.size(); i++) {
        SignatureData empty;
        bool hashSigned = SignSignature(keystore, scriptPubKey, mtx, i, 1000, sigHashes.at(i % sigHashes.size()), empty);
        assert(hashSigned);
    }

    DataStream ssout;
    ssout << TX_WITH_WITNESS(mtx);
    CTransaction tx(deserialize, TX_WITH_WITNESS, ssout);

    // check all inputs concurrently, with the cache
    PrecomputedTransactionData txdata(tx);
    CCheckQueue<CScriptCheck> scriptcheckqueue(/*batch_size=*/128, /*worker_threads_num=*/20);
    CCheckQueueControl<CScriptCheck> control(&scriptcheckqueue);

    std::vector<Coin> coins;
    for(uint32_t i = 0; i < mtx.vin.size(); i++) {
        Coin coin;
        coin.nHeight = 1;
        coin.fCoinBase = false;
        coin.out.nValue = 1000;
        coin.out.scriptPubKey = scriptPubKey;
        coins.emplace_back(std::move(coin));
    }

    SignatureCache signature_cache{DEFAULT_SIGNATURE_CACHE_BYTES};

    for(uint32_t i = 0; i < mtx.vin.size(); i++) {
        std::vector<CScriptCheck> vChecks;
        vChecks.emplace_back(coins[tx.vin[i].prevout.n].out, tx, signature_cache, i, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false, &txdata);
        control.Add(std::move(vChecks));
    }

    bool controlCheck = control.Wait();
    assert(controlCheck);
}